

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

void __thiscall si9ma::SinglyLinkedList::reverse_list(SinglyLinkedList *this)

{
  SinglyNodeWithRand *pSVar1;
  SinglyNodeWithRand *ptr;
  SinglyNodeWithRand *next;
  SinglyNodeWithRand *cur;
  SinglyNodeWithRand *prev;
  SinglyLinkedList *this_local;
  
  if (1 < this->size) {
    cur = this->head;
    next = this->head->next;
    while (next != (SinglyNodeWithRand *)0x0) {
      pSVar1 = next->next;
      next->next = cur;
      cur = next;
      next = pSVar1;
    }
    this->head->next = (SinglyNodeWithRand *)0x0;
    this->head = this->tail;
    this->tail = this->head;
  }
  return;
}

Assistant:

void SinglyLinkedList::reverse_list() {
        if (size < 2)
            return;

        SinglyNodeWithRand *prev = head;
        SinglyNodeWithRand *cur = head->next;
        SinglyNodeWithRand *next = head->next->next;

        while (cur){
            next = cur->next;
            cur->next = prev;
            prev = cur;
            cur = next;
        }

        head->next = nullptr;
        SinglyNodeWithRand *ptr = head;
        head = tail;
        tail = head;
    }